

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O3

MPP_RET hal_m2vd_vdpu1_init(void *hal,MppHalCfg *cfg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  MPP_RET MVar3;
  void *ptr;
  char *fmt;
  MppBufferGroup group;
  undefined1 auVar4 [16];
  
  ptr = mpp_osal_calloc("hal_m2vd_vdpu1_init",0x194);
  if (ptr == (void *)0x0) {
    _mpp_log_l(2,"hal_m2vd_vdpu1","failed to malloc register ret\n","hal_m2vd_vdpu1_init");
    MVar3 = MPP_ERR_MALLOC;
    if (hal == (void *)0x0) {
      return MPP_ERR_MALLOC;
    }
    goto LAB_001fb062;
  }
  *(undefined4 *)((long)hal + 0xa8) = 0x65;
  MVar3 = mpp_dev_init((MppDev *)((long)hal + 0x90),VPU_CLIENT_VDPU1);
  if (MVar3 == MPP_OK) {
    group = *(MppBufferGroup *)((long)hal + 0x70);
    if (group == (MppBufferGroup)0x0) {
      MVar3 = mpp_buffer_group_get
                        ((MppBufferGroup *)((long)hal + 0x70),MPP_BUFFER_TYPE_ION,
                         MPP_BUFFER_INTERNAL,"hal_m2vd_vdpu1","hal_m2vd_vdpu1_init");
      if (MVar3 == MPP_OK) {
        group = *(MppBufferGroup *)((long)hal + 0x70);
        goto LAB_001fafde;
      }
      fmt = "m2v_hal mpp_buffer_group_get failed\n";
    }
    else {
LAB_001fafde:
      MVar3 = mpp_buffer_get_with_tag
                        (group,(MppBuffer *)((long)hal + 0x78),0x100,"hal_m2vd_vdpu1",
                         "hal_m2vd_vdpu1_init");
      if (MVar3 == MPP_OK) {
        uVar1 = cfg->frame_slots;
        uVar2 = cfg->packet_slots;
        auVar4._8_4_ = (int)uVar1;
        auVar4._0_8_ = uVar2;
        auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
        *(undefined1 (*) [16])((long)hal + 0x58) = auVar4;
        *(MppCbCtx **)((long)hal + 0x88) = cfg->dec_cb;
        *(void **)((long)hal + 0x68) = ptr;
        cfg->dev = *(MppDev *)((long)hal + 0x90);
        return MPP_OK;
      }
      fmt = "m2v_hal_qtable_base get buffer failed\n";
    }
    _mpp_log_l(2,"hal_m2vd_vdpu1",fmt,(char *)0x0);
  }
  else {
    _mpp_log_l(2,"hal_m2vd_vdpu1","mpp_dev_init failed. ret: %d\n","hal_m2vd_vdpu1_init",
               (ulong)(uint)MVar3);
    MVar3 = MPP_ERR_UNKNOW;
  }
  mpp_osal_free("hal_m2vd_vdpu1_init",ptr);
LAB_001fb062:
  hal_m2vd_vdpu1_deinit(hal);
  return MVar3;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
    M2vdVdpu1Reg_t *regs = NULL;

    regs = mpp_calloc(M2vdVdpu1Reg_t, 1);
    if (NULL == regs) {
        mpp_err_f("failed to malloc register ret\n");
        ret = MPP_ERR_MALLOC;
        goto __ERR_RET;
    }

    ctx->reg_len = M2VD_VDPU1_REG_NUM;

    ret = mpp_dev_init(&ctx->dev, VPU_CLIENT_VDPU1);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        ret = MPP_ERR_UNKNOW;
        goto __ERR_RET;
    }
    if (ctx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("m2v_hal mpp_buffer_group_get failed\n");
            goto __ERR_RET;
        }
    }
    ret = mpp_buffer_get(ctx->group, &ctx->qp_table, M2VD_BUF_SIZE_QPTAB);
    if (ret) {
        mpp_err("m2v_hal_qtable_base get buffer failed\n");
        goto __ERR_RET;
    }

    ctx->packet_slots   = cfg->packet_slots;
    ctx->frame_slots    = cfg->frame_slots;
    ctx->dec_cb         = cfg->dec_cb;
    ctx->regs           = (void*)regs;
    cfg->dev            = ctx->dev;

    return ret;

__ERR_RET:
    if (regs) {
        mpp_free(regs);
        regs = NULL;
    }

    if (ctx) {
        hal_m2vd_vdpu1_deinit(ctx);
    }

    return ret;
}